

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O2

void __thiscall
gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::freeAll
          (StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_> *this)

{
  FedInfo **ppFVar1;
  uint uVar2;
  int ii;
  ulong uVar3;
  long lVar4;
  
  if (this->dataptr != (FedInfo **)0x0) {
    uVar2 = this->dataSlotIndex;
    if (0 < (long)(int)uVar2) {
      operator_delete(this->dataptr[(int)uVar2],0x200);
      uVar2 = this->dataSlotIndex;
    }
    for (uVar3 = (ulong)uVar2; 0 < (int)uVar3; uVar3 = uVar3 - 1) {
      operator_delete(this->dataptr[uVar3 - 1],0x200);
    }
    if (this->dataSlotIndex == 0) {
      operator_delete(*this->dataptr,0x200);
    }
    for (lVar4 = 0; ppFVar1 = this->freeblocks, lVar4 < this->freeIndex; lVar4 = lVar4 + 1) {
      operator_delete(ppFVar1[lVar4],0x200);
    }
    if (ppFVar1 != (FedInfo **)0x0) {
      operator_delete__(ppFVar1);
    }
    if (this->dataptr != (FedInfo **)0x0) {
      operator_delete__(this->dataptr);
      return;
    }
  }
  return;
}

Assistant:

void freeAll()
        {
            if (dataptr != nullptr) {
                Allocator a;
                for (int jj = bsize - 1; jj >= 0;
                     --jj) {  // call destructors on the last block
                    dataptr[dataSlotIndex][jj].~X();
                }
                if (dataSlotIndex > 0) {
                    a.deallocate(dataptr[dataSlotIndex], blockSize);
                }
                // go in reverse order
                for (int ii = dataSlotIndex - 1; ii >= 0; --ii) {
                    for (int jj = blockSize - 1; jj >= 0;
                         --jj) {  // call destructors on the middle blocks
                        dataptr[ii][jj].~X();
                    }
                    a.deallocate(dataptr[ii], blockSize);
                }
                if (dataSlotIndex == 0) {
                    a.deallocate(dataptr[0], blockSize);
                }

                for (int ii = 0; ii < freeIndex; ++ii) {
                    a.deallocate(freeblocks[ii], blockSize);
                }
                // delete can handle a nullptr
                delete[] freeblocks;
                delete[] dataptr;
            }
        }